

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O0

void * asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                 (long param_1,long param_2,ulong param_3)

{
  byte *pbVar1;
  ulong uVar2;
  void *pvVar3;
  undefined1 local_74;
  uchar *mem;
  void *pointer;
  void *pointer_2;
  int mem_index_1;
  uchar *mem_1;
  void *pointer_1;
  int mem_index;
  size_t chunks;
  size_t align_local;
  size_t size_local;
  thread_info_base *this_thread_local;
  
  uVar2 = param_2 + 3U >> 2;
  if (param_1 != 0) {
    for (pointer_1._4_4_ = 0; pointer_1._4_4_ < 2; pointer_1._4_4_ = pointer_1._4_4_ + 1) {
      if (((*(long *)(param_1 + (long)pointer_1._4_4_ * 8) != 0) &&
          (pbVar1 = *(byte **)(param_1 + (long)pointer_1._4_4_ * 8), uVar2 <= *pbVar1)) &&
         ((ulong)pbVar1 % param_3 == 0)) {
        *(undefined8 *)(param_1 + (long)pointer_1._4_4_ * 8) = 0;
        pbVar1[param_2] = *pbVar1;
        return pbVar1;
      }
    }
    for (pointer_2._4_4_ = 0; pointer_2._4_4_ < 2; pointer_2._4_4_ = pointer_2._4_4_ + 1) {
      if (*(long *)(param_1 + (long)pointer_2._4_4_ * 8) != 0) {
        pvVar3 = *(void **)(param_1 + (long)pointer_2._4_4_ * 8);
        *(undefined8 *)(param_1 + (long)pointer_2._4_4_ * 8) = 0;
        aligned_delete(pvVar3);
        break;
      }
    }
  }
  pvVar3 = aligned_new(param_3,uVar2 * 4 + 1);
  if (uVar2 < 0x100) {
    local_74 = (undefined1)uVar2;
  }
  else {
    local_74 = 0;
  }
  *(undefined1 *)((long)pvVar3 + param_2) = local_74;
  return pvVar3;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size, std::size_t align = ASIO_DEFAULT_ALIGN)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread)
    {
      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          unsigned char* const mem = static_cast<unsigned char*>(pointer);
          if (static_cast<std::size_t>(mem[0]) >= chunks
              && reinterpret_cast<std::size_t>(pointer) % align == 0)
          {
            this_thread->reusable_memory_[mem_index] = 0;
            mem[size] = mem[0];
            return pointer;
          }
        }
      }

      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          this_thread->reusable_memory_[mem_index] = 0;
          aligned_delete(pointer);
          break;
        }
      }
    }

    void* const pointer = aligned_new(align, chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }